

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::python::Generator::PrintMessages(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x48)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      PrintMessage(this,(Descriptor *)(*(long *)(pFVar1 + 0x50) + lVar3));
      google::protobuf::io::Printer::Print((char *)this->printer_);
      lVar2 = lVar2 + 1;
      pFVar1 = this->file_;
      lVar3 = lVar3 + 0x78;
    } while (lVar2 < *(int *)(pFVar1 + 0x48));
  }
  return;
}

Assistant:

void Generator::PrintMessages() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    PrintMessage(*file_->message_type(i));
    printer_->Print("\n");
  }
}